

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricDistributionPoint::~IfcElectricDistributionPoint
          (IfcElectricDistributionPoint *this)

{
  IfcElement *this_00;
  void *pvVar1;
  
  *(undefined8 *)
   &this[-1].super_IfcFlowController.super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70 = 0x9c10c8;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x58 = 0x9c1230;
  *(undefined8 *)
   &this[-1].super_IfcFlowController.super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.Representation.have = 0x9c10f0;
  *(undefined8 *)
   &this[-1].super_IfcFlowController.super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.field_0x108 = 0x9c1118;
  *(undefined8 *)
   &this[-1].super_IfcFlowController.super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.field_0x140 = 0x9c1140;
  *(undefined8 *)&this[-1].super_IfcFlowController.field_0x170 = 0x9c1168;
  this[-1].UserDefinedFunction.ptr.field_2._M_allocated_capacity = 0x9c1190;
  *(undefined8 *)&this[-1].UserDefinedFunction.have = 0x9c11b8;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x9c11e0;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x9c1208;
  pvVar1 = *(void **)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.
                      super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject
                      .field_0x30;
  if ((undefined1 *)pvVar1 !=
      &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement
       .super_IfcElement.super_IfcProduct.super_IfcObject.field_0x40) {
    operator_delete(pvVar1);
  }
  this_00 = (IfcElement *)
            &this[-1].super_IfcFlowController.super_IfcDistributionFlowElement.
             super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject.
             field_0x70;
  pvVar1 = *(void **)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.
                      super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject
                      .field_0x10;
  if ((undefined1 *)pvVar1 !=
      &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement
       .super_IfcElement.super_IfcProduct.super_IfcObject.field_0x20) {
    operator_delete(pvVar1);
  }
  IfcElement::~IfcElement(this_00,&PTR_construction_vtable_24__009c1260);
  operator_delete(this_00);
  return;
}

Assistant:

IfcElectricDistributionPoint() : Object("IfcElectricDistributionPoint") {}